

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O3

void __thiscall OpenMD::NPT::NPT(NPT *this,SimInfo *info)

{
  double dVar1;
  SimInfo *pSVar2;
  Globals *pGVar3;
  Snapshot *this_00;
  undefined4 uVar4;
  undefined4 uVar5;
  Mat3x3d local_68;
  
  VelocityVerletIntegrator::VelocityVerletIntegrator(&this->super_VelocityVerletIntegrator,info);
  (this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPT_00306b10;
  (this->oldPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oldVel).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldVel).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldVel).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oldJi).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldJi).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldJi).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->etaTolerance = 1e-06;
  (this->thermostat).first = 0.0;
  (this->thermostat).second = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  this->chiTolerance = 1e-06;
  this->maxIterNum_ = 4;
  pSVar2 = (this->super_VelocityVerletIntegrator).super_Integrator.info_;
  pGVar3 = pSVar2->simParams_;
  if ((pGVar3->UseIntialExtendedSystemState).super_ParameterBase.field_0x2b == '\0') {
    this_00 = pSVar2->sman_->currentSnapshot_;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    Snapshot::setThermostat(this_00,(pair<double,_double> *)&local_68);
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    Snapshot::setBarostat(this_00,&local_68);
  }
  if ((pGVar3->TargetTemp).super_ParameterBase.empty_ == true) {
    builtin_strncpy(painCave.errMsg,"You can\'t use the NVT integrator without a targetTemp!\n",0x38
                   );
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->targetTemp = (pGVar3->TargetTemp).data_;
  }
  if ((pGVar3->TauThermostat).super_ParameterBase.empty_ == true) {
    memcpy(&painCave,
           "If you use the constant temperature\n\tintegrator, you must set tauThermostat.\n",0x4e);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->tauThermostat = (pGVar3->TauThermostat).data_;
  }
  if ((pGVar3->TargetPressure).super_ParameterBase.empty_ == true) {
    memcpy(&painCave,"NPT error: You can\'t use the NPT integrator\n   without a targetPressure!\n",
           0x4a);
    painCave.isFatal = 1;
    simError();
  }
  else {
    this->targetPressure = (pGVar3->TargetPressure).data_;
  }
  if ((pGVar3->TauBarostat).super_ParameterBase.empty_ == true) {
    builtin_strncpy(painCave.errMsg + 0x30,"arostat.\n",10);
    builtin_strncpy(painCave.errMsg + 0x20,"ou must set tauB",0x10);
    builtin_strncpy(painCave.errMsg + 0x10,"PT integrator, y",0x10);
    builtin_strncpy(painCave.errMsg,"If you use the N",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    uVar4 = SUB84(this->tauBarostat,0);
    uVar5 = (undefined4)((ulong)this->tauBarostat >> 0x20);
  }
  else {
    dVar1 = (pGVar3->TauBarostat).data_;
    uVar4 = SUB84(dVar1,0);
    uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    this->tauBarostat = dVar1;
  }
  this->tt2 = this->tauThermostat * this->tauThermostat;
  this->tb2 = (double)CONCAT44(uVar5,uVar4) * (double)CONCAT44(uVar5,uVar4);
  Integrator::updateSizes((Integrator *)this);
  return;
}

Assistant:

NPT::NPT(SimInfo* info) :
      VelocityVerletIntegrator(info), etaTolerance(1e-6), chiTolerance(1e-6),
      maxIterNum_(4) {
    Globals* simParams = info_->getSimParams();

    if (!simParams->getUseIntialExtendedSystemState()) {
      Snapshot* currSnapshot =
          info_->getSnapshotManager()->getCurrentSnapshot();
      currSnapshot->setThermostat(make_pair(0.0, 0.0));
      currSnapshot->setBarostat(Mat3x3d(0.0));
    }

    if (!simParams->haveTargetTemp()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "You can't use the NVT integrator without a targetTemp!\n");
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    } else {
      targetTemp = simParams->getTargetTemp();
    }

    // We must set tauThermostat
    if (!simParams->haveTauThermostat()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the constant temperature\n"
               "\tintegrator, you must set tauThermostat.\n");

      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      tauThermostat = simParams->getTauThermostat();
    }

    if (!simParams->haveTargetPressure()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NPT error: You can't use the NPT integrator\n"
               "   without a targetPressure!\n");

      painCave.isFatal = 1;
      simError();
    } else {
      targetPressure = simParams->getTargetPressure();
    }

    if (!simParams->haveTauBarostat()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the NPT integrator, you must set tauBarostat.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      tauBarostat = simParams->getTauBarostat();
    }

    tt2 = tauThermostat * tauThermostat;
    tb2 = tauBarostat * tauBarostat;

    updateSizes();
  }